

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

MatchInfoCollection * __thiscall
icu_63::TZDBTimeZoneNames::find
          (TZDBTimeZoneNames *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  UChar **ppUVar1;
  char **ppcVar2;
  UBool UVar3;
  int32_t iVar4;
  int iVar5;
  StringEnumeration *pSVar6;
  UChar *pUVar7;
  undefined8 *puVar8;
  undefined4 extraout_var;
  TZDBNames *pTVar10;
  int32_t iVar11;
  MatchInfoCollection *pMVar12;
  UChar *s2;
  UChar *s1;
  bool bVar13;
  TZDBNameSearchHandler handler;
  TextTrieMapSearchResultHandler local_50;
  uint32_t local_48;
  undefined4 local_44;
  MatchInfoCollection *local_40;
  char *local_38;
  UnicodeString *pUVar9;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gTZDBNamesTrieInitOnce == 2) ||
       (pUVar9 = text, UVar3 = umtx_initImplPreInit((UInitOnce *)&gTZDBNamesTrieInitOnce),
       UVar3 == '\0')) {
      if (U_ZERO_ERROR < DAT_00491f5c) {
        *status = DAT_00491f5c;
      }
    }
    else {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        gTZDBNamesTrie = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,(size_t)pUVar9);
        if (gTZDBNamesTrie == (TextTrieMap *)0x0) {
          gTZDBNamesTrie = (TextTrieMap *)0x0;
        }
        else {
          gTZDBNamesTrie->_vptr_TextTrieMap = (_func_int **)&PTR__TextTrieMap_00479828;
          gTZDBNamesTrie->fIgnoreCase = '\x01';
          gTZDBNamesTrie->fNodes = (CharacterNode *)0x0;
          gTZDBNamesTrie->fNodesCapacity = 0;
          gTZDBNamesTrie->fNodesCount = 0;
          gTZDBNamesTrie->fLazyContents = (UVector *)0x0;
          gTZDBNamesTrie->fIsEmpty = '\x01';
          gTZDBNamesTrie->fValueDeleter = deleteTZDBNameInfo;
        }
        if (gTZDBNamesTrie == (TextTrieMap *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          pSVar6 = TimeZoneNamesImpl::_getAvailableMetaZoneIDs(status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            do {
              iVar5 = (*(pSVar6->super_UObject)._vptr_UObject[7])(pSVar6,status);
              pUVar9 = (UnicodeString *)CONCAT44(extraout_var,iVar5);
              if ((pUVar9 == (UnicodeString *)0x0) || (U_ZERO_ERROR < *status)) break;
              pTVar10 = getMetaZoneNames(pUVar9,status);
              iVar5 = 3;
              if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (iVar5 = 2, pTVar10 != (TZDBNames *)0x0))
              {
                ppUVar1 = pTVar10->fNames;
                if (ppUVar1 == (UChar **)0x0) {
                  s1 = (UChar *)0x0;
                  s2 = (UChar *)0x0;
                }
                else {
                  s1 = *ppUVar1;
                  s2 = ppUVar1[1];
                }
                if (s1 != (UChar *)0x0 || s2 != (UChar *)0x0) {
                  ppcVar2 = pTVar10->fRegions;
                  bVar13 = false;
                  iVar11 = 0;
                  if (ppcVar2 != (char **)0x0) {
                    iVar11 = pTVar10->fNumRegions;
                  }
                  if (s2 != (UChar *)0x0 && s1 != (UChar *)0x0) {
                    iVar4 = u_strcmp_63(s1,s2);
                    bVar13 = iVar4 == 0;
                  }
                  pUVar7 = ZoneMeta::findMetaZoneID(pUVar9);
                  if (s1 != (UChar *)0x0) {
                    puVar8 = (undefined8 *)uprv_malloc_63(0x20);
                    if (puVar8 == (undefined8 *)0x0) {
                      *status = U_MEMORY_ALLOCATION_ERROR;
                      iVar5 = 3;
                      goto LAB_00286914;
                    }
                    *puVar8 = pUVar7;
                    *(undefined4 *)(puVar8 + 1) = 0x10;
                    *(bool *)((long)puVar8 + 0xc) = bVar13;
                    puVar8[2] = ppcVar2;
                    *(int32_t *)(puVar8 + 3) = iVar11;
                    TextTrieMap::put(gTZDBNamesTrie,s1,puVar8,status);
                  }
                  if ((s2 != (UChar *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
                    puVar8 = (undefined8 *)uprv_malloc_63(0x20);
                    if (puVar8 == (undefined8 *)0x0) {
                      *status = U_MEMORY_ALLOCATION_ERROR;
                      iVar5 = 3;
                      goto LAB_00286914;
                    }
                    *puVar8 = pUVar7;
                    *(undefined4 *)(puVar8 + 1) = 0x20;
                    *(bool *)((long)puVar8 + 0xc) = bVar13;
                    puVar8[2] = ppcVar2;
                    *(int32_t *)(puVar8 + 3) = iVar11;
                    TextTrieMap::put(gTZDBNamesTrie,s2,puVar8,status);
                  }
                  iVar5 = 0;
                }
              }
LAB_00286914:
            } while (iVar5 != 3);
          }
          if (pSVar6 != (StringEnumeration *)0x0) {
            (*(pSVar6->super_UObject)._vptr_UObject[1])();
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            ucln_i18n_registerCleanup_63(UCLN_I18N_TZDBTIMEZONENAMES,tzdbTimeZoneNames_cleanup);
          }
          else {
            if (gTZDBNamesTrie != (TextTrieMap *)0x0) {
              (*gTZDBNamesTrie->_vptr_TextTrieMap[1])();
            }
            gTZDBNamesTrie = (TextTrieMap *)0x0;
          }
        }
      }
      DAT_00491f5c = *status;
      umtx_initImplPostInit((UInitOnce *)&gTZDBNamesTrieInitOnce);
    }
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_38 = this->fRegion;
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_004799b8;
    local_44 = 0;
    local_40 = (MatchInfoCollection *)0x0;
    local_48 = types;
    TextTrieMap::search(gTZDBNamesTrie,text,start,&local_50,status);
    pMVar12 = local_40;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_40 = (MatchInfoCollection *)0x0;
      local_44 = 0;
    }
    else {
      pMVar12 = (MatchInfoCollection *)0x0;
    }
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_004799b8;
    if (local_40 != (MatchInfoCollection *)0x0) {
      (*local_40->_vptr_MatchInfoCollection[1])();
    }
  }
  else {
    pMVar12 = (MatchInfoCollection *)0x0;
  }
  return pMVar12;
}

Assistant:

TZDBTimeZoneNames::MatchInfoCollection*
TZDBTimeZoneNames::find(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    umtx_initOnce(gTZDBNamesTrieInitOnce, &prepareFind, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNameSearchHandler handler(types, fRegion);
    gTZDBNamesTrie->search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    int32_t maxLen = 0;
    return handler.getMatches(maxLen);
}